

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

char * __thiscall FBehavior::LookupString(FBehavior *this,DWORD index)

{
  DWORD *list;
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  
  list = (DWORD *)(ulong)this->StringTable;
  if (list == (DWORD *)0x0) {
    return (char *)0x0;
  }
  puVar2 = (uint *)this->Data;
  puVar1 = (uint *)((long)list + (long)puVar2);
  if (this->Format == ACS_Old) {
    if (*puVar1 <= index) {
      return (char *)0x0;
    }
    iVar3 = 1;
  }
  else {
    if (puVar1[1] <= index) {
      return (char *)0x0;
    }
    iVar3 = 3;
    puVar2 = puVar1;
  }
  return (char *)((ulong)puVar1[iVar3 + index] + (long)puVar2);
}

Assistant:

const char *FBehavior::LookupString (DWORD index) const
{
	if (StringTable == 0)
	{
		return NULL;
	}
	if (Format == ACS_Old)
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[0])
			return NULL;	// Out of range for this list;
		return (const char *)(Data + list[1+index]);
	}
	else
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[1])
			return NULL;	// Out of range for this list
		return (const char *)(Data + StringTable + list[3+index]);
	}
}